

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O3

void __thiscall
webrtc::SincResampler::Resample(SincResampler *this,size_t frames,float *destination)

{
  double dVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  int iVar6;
  float *pfVar7;
  byte bVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  bVar8 = 0;
  if ((frames == 0) || (this->buffer_primed_ != false)) {
    if (frames == 0) {
      return;
    }
  }
  else {
    (*this->read_cb_->_vptr_SincResamplerCallback[2])
              (this->read_cb_,this->request_frames_,this->r0_);
    this->buffer_primed_ = true;
  }
  dVar1 = this->io_sample_rate_ratio_;
  pfVar2 = (this->kernel_storage_)._M_t.super___uniq_ptr_impl<float,_webrtc::AlignedFreeDeleter>.
           _M_t.super__Tuple_impl<0UL,_float_*,_webrtc::AlignedFreeDeleter>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  do {
    dVar11 = ((double)CONCAT44(0x45300000,(int)(this->block_size_ >> 0x20)) - 1.9342813113834067e+25
             ) + ((double)CONCAT44(0x43300000,(int)this->block_size_) - 4503599627370496.0);
    dVar12 = this->virtual_source_idx_;
    dVar10 = ceil((dVar11 - dVar12) / dVar1);
    if (0 < (int)dVar10) {
      iVar6 = (int)dVar10 + 1;
      do {
        if (((double)CONCAT44(0x45300000,(int)(this->block_size_ >> 0x20)) - 1.9342813113834067e+25)
            + ((double)CONCAT44(0x43300000,(int)this->block_size_) - 4503599627370496.0) <= dVar12)
        {
          __assert_fail("virtual_source_idx_ < block_size_",
                        "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                        ,0x124,"void webrtc::SincResampler::Resample(size_t, float *)");
        }
        dVar11 = (dVar12 - (double)(int)dVar12) * 32.0;
        iVar3 = (int)dVar11;
        pfVar5 = pfVar2 + (long)iVar3 * 0x20;
        if (((ulong)pfVar5 & 0xf) != 0) {
          __assert_fail("0u == (reinterpret_cast<uintptr_t>(k1) & 0x0F)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                        ,0x136,"void webrtc::SincResampler::Resample(size_t, float *)");
        }
        fVar9 = Convolve_SSE(this->r1_ + (int)dVar12,pfVar5,pfVar5 + 0x20,dVar11 - (double)iVar3);
        *destination = fVar9;
        dVar12 = this->virtual_source_idx_ + dVar1;
        this->virtual_source_idx_ = dVar12;
        if (frames == 1) {
          return;
        }
        destination = destination + 1;
        iVar6 = iVar6 + -1;
        frames = frames - 1;
      } while (1 < iVar6);
      dVar11 = ((double)CONCAT44(0x45300000,(int)(this->block_size_ >> 0x20)) -
               1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->block_size_) - 4503599627370496.0);
    }
    this->virtual_source_idx_ = dVar12 - dVar11;
    pfVar5 = this->r3_;
    pfVar7 = this->r1_;
    for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pfVar7 = *pfVar5;
      pfVar5 = pfVar5 + (ulong)bVar8 * -2 + 1;
      pfVar7 = pfVar7 + (ulong)bVar8 * -2 + 1;
    }
    pfVar5 = this->r0_;
    if (pfVar5 == this->r2_) {
      UpdateRegions(this,true);
      pfVar5 = this->r0_;
    }
    (*this->read_cb_->_vptr_SincResamplerCallback[2])(this->read_cb_,this->request_frames_,pfVar5);
  } while( true );
}

Assistant:

void SincResampler::Resample(size_t frames, float* destination) {
  size_t remaining_frames = frames;

  // Step (1) -- Prime the input buffer at the start of the input stream.
  if (!buffer_primed_ && remaining_frames) {
    read_cb_->Run(request_frames_, r0_);
    buffer_primed_ = true;
  }

  // Step (2) -- Resample!  const what we can outside of the loop for speed.  It
  // actually has an impact on ARM performance.  See inner loop comment below.
  const double current_io_ratio = io_sample_rate_ratio_;
  const float* const kernel_ptr = kernel_storage_.get();
  while (remaining_frames) {
    // |i| may be negative if the last Resample() call ended on an iteration
    // that put |virtual_source_idx_| over the limit.
    //
    // Note: The loop construct here can severely impact performance on ARM
    // or when built with clang.  See https://codereview.chromium.org/18566009/
    for (int i = static_cast<int>(
             ceil((block_size_ - virtual_source_idx_) / current_io_ratio));
         i > 0; --i) {
      assert(virtual_source_idx_ < block_size_);

      // |virtual_source_idx_| lies in between two kernel offsets so figure out
      // what they are.
      const int source_idx = static_cast<int>(virtual_source_idx_);
      const double subsample_remainder = virtual_source_idx_ - source_idx;

      const double virtual_offset_idx =
          subsample_remainder * kKernelOffsetCount;
      const int offset_idx = static_cast<int>(virtual_offset_idx);

      // We'll compute "convolutions" for the two kernels which straddle
      // |virtual_source_idx_|.
      const float* const k1 = kernel_ptr + offset_idx * kKernelSize;
      const float* const k2 = k1 + kKernelSize;

      // Ensure |k1|, |k2| are 16-byte aligned for SIMD usage.  Should always be
      // true so long as kKernelSize is a multiple of 16.
      assert(0u == (reinterpret_cast<uintptr_t>(k1) & 0x0F));
      assert(0u == (reinterpret_cast<uintptr_t>(k2) & 0x0F));

      // Initialize input pointer based on quantized |virtual_source_idx_|.
      const float* const input_ptr = r1_ + source_idx;

      // Figure out how much to weight each kernel's "convolution".
      const double kernel_interpolation_factor =
          virtual_offset_idx - offset_idx;
      *destination++ = CONVOLVE_FUNC(
          input_ptr, k1, k2, kernel_interpolation_factor);

      // Advance the virtual index.
      virtual_source_idx_ += current_io_ratio;

      if (!--remaining_frames)
        return;
    }

    // Wrap back around to the start.
    virtual_source_idx_ -= block_size_;

    // Step (3) -- Copy r3_, r4_ to r1_, r2_.
    // This wraps the last input frames back to the start of the buffer.
    memcpy(r1_, r3_, sizeof(*input_buffer_.get()) * kKernelSize);

    // Step (4) -- Reinitialize regions if necessary.
    if (r0_ == r2_)
      UpdateRegions(true);

    // Step (5) -- Refresh the buffer with more input.
    read_cb_->Run(request_frames_, r0_);
  }
}